

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastQueue.hpp
# Opt level: O2

void __thiscall
BCL::
FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
::~FastQueue(FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
             *this)

{
  GlobalPtr<int> ptr;
  GlobalPtr<int> ptr_00;
  size_t unaff_RBX;
  size_t unaff_retaddr;
  
  if ((my_rank == this->my_host) && (bcl_finalized == '\0')) {
    if ((this->head).rank != 0 || (this->head).ptr != 0) {
      ptr.ptr = unaff_retaddr;
      ptr.rank = unaff_RBX;
      dealloc<int>(ptr);
    }
    if ((this->tail).rank != 0 || (this->tail).ptr != 0) {
      ptr_00.ptr = unaff_retaddr;
      ptr_00.rank = unaff_RBX;
      dealloc<int>(ptr_00);
    }
  }
  Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
  ::~Array(&this->data);
  return;
}

Assistant:

~FastQueue() {
    if (BCL::rank() == host() && !BCL::bcl_finalized) {
      if (head != nullptr) {
        dealloc(head);
      }
      if (tail != nullptr) {
        dealloc(tail);
      }
    }
  }